

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O2

ARKodeSPRKTable arkodeSymplecticCandyRozmus4(void)

{
  sunrealtype *psVar1;
  ARKodeSPRKTable pAVar2;
  
  pAVar2 = ARKodeSPRKTable_Alloc(4);
  if (pAVar2 != (ARKodeSPRKTable)0x0) {
    pAVar2->q = 4;
    pAVar2->stages = 4;
    psVar1 = pAVar2->a;
    *psVar1 = 0.6756035959798289;
    psVar1[1] = -0.17560359597982886;
    psVar1[2] = -0.17560359597982886;
    psVar1[3] = 0.6756035959798289;
    psVar1 = pAVar2->ahat;
    *(undefined4 *)psVar1 = 0;
    *(undefined4 *)((long)psVar1 + 4) = 0;
    *(undefined4 *)(psVar1 + 1) = 0x6eb96339;
    *(undefined4 *)((long)psVar1 + 0xc) = 0x3ff59e8b;
    psVar1[2] = -1.7024143839193155;
    psVar1[3] = 1.3512071919596578;
  }
  return pAVar2;
}

Assistant:

static ARKodeSPRKTable arkodeSymplecticCandyRozmus4(void)
{
  ARKodeSPRKTable sprk_table = ARKodeSPRKTable_Alloc(4);
  if (!sprk_table) { return NULL; }
  sprk_table->q      = 4;
  sprk_table->stages = 4;
  sprk_table->a[0] =
    (SUN_RCONST(2.0) +
     SUNRpowerR(SUN_RCONST(2.0), SUN_RCONST(1.0) / SUN_RCONST(3.0)) +
     SUNRpowerR(SUN_RCONST(2.0), -SUN_RCONST(1.0) / SUN_RCONST(3.0))) /
    SUN_RCONST(6.0);
  sprk_table->a[1] =
    (SUN_RCONST(1.0) -
     SUNRpowerR(SUN_RCONST(2.0), SUN_RCONST(1.0) / SUN_RCONST(3.0)) -
     SUNRpowerR(SUN_RCONST(2.0), -SUN_RCONST(1.0) / SUN_RCONST(3.0))) /
    SUN_RCONST(6.0);
  sprk_table->a[2]    = sprk_table->a[1];
  sprk_table->a[3]    = sprk_table->a[0];
  sprk_table->ahat[0] = SUN_RCONST(0.0);
  sprk_table->ahat[1] =
    SUN_RCONST(1.0) /
    (SUN_RCONST(2.0) -
     SUNRpowerR(SUN_RCONST(2.0), SUN_RCONST(1.0) / SUN_RCONST(3.0)));
  sprk_table->ahat[2] =
    SUN_RCONST(1.0) /
    (SUN_RCONST(1.0) -
     SUNRpowerR(SUN_RCONST(2.0), SUN_RCONST(2.0) / SUN_RCONST(3.0)));
  sprk_table->ahat[3] = sprk_table->ahat[1];
  return sprk_table;
}